

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateUTest.hpp
# Opt level: O3

void Qentem::Test::TestVariableUTag3(QTest *test)

{
  TagBit *pTVar1;
  QTest *pQVar2;
  char16_t *pcVar3;
  Array<Qentem::Tags::TagBit> tags_cache;
  Value<char16_t> value;
  StringStream<char16_t> ss;
  Array<Qentem::Tags::TagBit> local_a8;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_98;
  undefined8 local_88;
  char16_t *local_80;
  undefined4 local_78;
  QTest *local_70;
  anon_union_16_5_5c8fea6c_for_Value<char16_t>_1 local_68;
  undefined1 local_58;
  StringStream<char16_t> local_48;
  
  local_48.storage_ = (char16_t *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  local_68.array_.storage_ = (Value<char16_t> *)0x0;
  local_68._8_8_ = 0;
  local_58 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_48,(char16_t (*) [8])0x134ebc,0x159);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:a}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (test,&local_48,(char16_t (*) [8])L"{var:a}",0x15c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0[0]}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_48,(char16_t (*) [11])L"{var:0[0]}",0x160);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:a[0]}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a[0]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_48,(char16_t (*) [11])L"{var:a[0]}",0x164);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0[a]}";
  local_78 = 10;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[a]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (test,&local_48,(char16_t (*) [11])L"{var:0[a]}",0x168);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:a[abc]}";
  local_78 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:a[abc]}",0xc,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  local_70 = test;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[13]>
            (test,&local_48,(char16_t (*) [13])L"{var:a[abc]}",0x16c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_98.array_,(StringStream<char16_t> *)&local_a8,
             L"[[[]],{\"a\":[\"x\"],\"b\":{\"a\":\"X\"}}]",0x20);
  pTVar1 = local_a8.storage_;
  if (local_a8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_a8.storage_);
  }
  operator_delete(pTVar1);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_68.array_,(Value<char16_t> *)&local_98.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_98.array_);
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0}";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  pQVar2 = local_70;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (local_70,&local_48,(char16_t (*) [8])0x134ebc,0x174);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0[0]}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (pQVar2,&local_48,(char16_t (*) [11])L"{var:0[0]}",0x178);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0[0][0]}";
  local_78 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0[0][0]}",0xd,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[14]>
            (pQVar2,&local_48,(char16_t (*) [14])L"{var:0[0][0]}",0x17c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:1}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"{var:1}",0x182);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:2}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:2}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])0x1349be,0x186);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:1[a]}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1[a]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (pQVar2,&local_48,(char16_t (*) [11])L"{var:1[a]}",0x18a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:1[b]}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1[b]}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[11]>
            (pQVar2,&local_48,(char16_t (*) [11])L"{var:1[b]}",0x18e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  JSON::JSONParser<char16_t,_Qentem::StringStream<char16_t>_>::Parse
            ((ValueT *)&local_98.array_,(StringStream<char16_t> *)&local_a8,
             L"[\"A\", \"abc\", true, 456, 1.5]",0x1c);
  pTVar1 = local_a8.storage_;
  if (local_a8.storage_ != (TagBit *)0x0) {
    MemoryRecord::RemoveAllocation(local_a8.storage_);
  }
  operator_delete(pTVar1);
  Value<char16_t>::operator=
            ((Value<char16_t> *)&local_68.array_,(Value<char16_t> *)&local_98.array_);
  Value<char16_t>::~Value((Value<char16_t> *)&local_98.array_);
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0",6,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  pQVar2 = local_70;
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (local_70,&local_48,(char16_t (*) [7])0x135548,0x196);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"var:0}";
  local_78 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0}",6,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])0x134ebe,0x19a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v}";
  local_78 = 3;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v}",3,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (pQVar2,&local_48,(char16_t (*) [4])L"{v}",0x19e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va}";
  local_78 = 4;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va}",4,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar2,&local_48,(char16_t (*) [5])L"{va}",0x1a2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var}";
  local_78 = 5;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var}",5,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{var}",0x1a6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:}";
  local_78 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:}",6,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])L"{var:}",0x1aa);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v:0}";
  local_78 = 5;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v:0}",5,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{v:0}",0x1ae);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va:0}";
  local_78 = 6;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va:0}",6,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])L"{va:0}",0x1b2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0{var:0}";
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_78 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0{var:0}",0xd,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"{var:0A",0x1b8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"var:0{var:0}";
  local_78 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0{var:0}",0xc,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])0x1351aa,0x1bc);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"var:0}{var:0}";
  local_78 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:0}{var:0}",0xd,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"var:0}A",0x1c0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0{var:0}{var:0}";
  local_78 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0{var:0}{var:0}",0x14,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])L"{var:0AA",0x1c4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:1{var:0}";
  local_78 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1{var:0}",0xd,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"{var:1A",0x1ca);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"var:1{var:0}";
  local_78 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:1{var:0}",0xc,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])0x135222,0x1ce);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"var:1}{var:0}";
  local_78 = 0xd;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"var:1}{var:0}",0xd,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"var:1}A",0x1d2);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:1{var:0}{var:0}";
  local_78 = 0x14;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:1{var:0}{var:0}",0x14,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])L"{var:1AA",0x1d6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{{var:0}";
  local_78 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{{var:0}",8,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[3]>
            (pQVar2,&local_48,(char16_t (*) [3])L"{A",0x1dc);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{{var:0}{var:0}";
  local_78 = 0xf;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{{var:0}{var:0}",0xf,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (pQVar2,&local_48,(char16_t (*) [4])L"{AA",0x1e0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v{var:0}";
  local_78 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v{var:0}",9,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (pQVar2,&local_48,(char16_t (*) [4])L"{vA",0x1e4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v{var:0}{var:0}";
  local_78 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v{var:0}{var:0}",0x10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar2,&local_48,(char16_t (*) [5])L"{vAA",0x1e8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va{var:0}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va{var:0}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar2,&local_48,(char16_t (*) [5])L"{vaA",0x1ec);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va{var:0}{var:0}";
  local_78 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va{var:0}{var:0}",0x11,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{vaAA",0x1f0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var{var:0}";
  local_78 = 0xb;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var{var:0}",0xb,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{varA",500);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var{var:0}{var:0}";
  local_78 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var{var:0}{var:0}",0x12,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])L"{varAA",0x1f8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{-{var:0}";
  local_78 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{-{var:0}",9,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[4]>
            (pQVar2,&local_48,(char16_t (*) [4])L"{-A",0x1fe);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{-{var:0}{var:0}";
  local_78 = 0x10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{-{var:0}{var:0}",0x10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar2,&local_48,(char16_t (*) [5])L"{-AA",0x202);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v-{var:0}";
  local_78 = 10;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v-{var:0}",10,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[5]>
            (pQVar2,&local_48,(char16_t (*) [5])L"{v-A",0x206);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{v-{var:0}{var:0}";
  local_78 = 0x11;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{v-{var:0}{var:0}",0x11,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{v-AA",0x20a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va-{var:0}";
  local_78 = 0xb;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va-{var:0}",0xb,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[6]>
            (pQVar2,&local_48,(char16_t (*) [6])L"{va-A",0x20e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{va-{var:0}{var:0}";
  local_78 = 0x12;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{va-{var:0}{var:0}",0x12,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])L"{va-AA",0x212);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var-{var:0}";
  local_78 = 0xc;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-{var:0}",0xc,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])L"{var-A",0x216);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var-{var:0}{var:0}";
  local_78 = 0x13;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-{var:0}{var:0}",0x13,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L"{var-AA",0x21a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var-0}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var-0}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])0x1354fe,0x220);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var 0}";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var 0}",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])0x135510,0x224);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0 }";
  local_78 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0 }",8,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])0x135522,0x228);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0 ";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0 ",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])0x135536,0x22c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L"{var:0";
  local_78 = 6;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L"{var:0",6,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[7]>
            (pQVar2,&local_48,(char16_t (*) [7])0x135548,0x230);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L" {var-0}";
  local_78 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var-0}",8,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])L" {var-0}",0x234);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L" {var 0}";
  local_78 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var 0}",8,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])L" {var 0}",0x238);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L" {var:0 }";
  local_78 = 9;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0 }",9,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[10]>
            (pQVar2,&local_48,(char16_t (*) [10])L" {var:0 }",0x23c);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L" {var:0 ";
  local_78 = 8;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0 ",8,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[9]>
            (pQVar2,&local_48,(char16_t (*) [9])L" {var:0 ",0x240);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  local_88 = 0;
  local_a8.storage_ = (TagBit *)0x0;
  local_a8.index_ = 0;
  local_a8.capacity_ = 0;
  local_98.array_.storage_ = (Value<char16_t> *)0x0;
  local_98._8_8_ = 0;
  local_80 = L" {var:0";
  local_78 = 7;
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::parse
            (L" {var:0",7,&local_a8);
  TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_>::Render
            ((TemplateCore<char16_t,_Qentem::Value<char16_t>,_Qentem::StringStream<char16_t>_> *)
             &local_98.array_,&local_a8,(Value<char16_t> *)&local_68.array_,&local_48);
  Array<Qentem::Tags::TagBit>::~Array(&local_a8);
  QTest::IsEqual<Qentem::StringStream<char16_t>,char16_t[8]>
            (pQVar2,&local_48,(char16_t (*) [8])L" {var:0",0x244);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char16_t>::~Value((Value<char16_t> *)&local_68.array_);
  pcVar3 = local_48.storage_;
  if (local_48.storage_ != (char16_t *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(pcVar3);
  return;
}

Assistant:

static void TestVariableUTag3(QTest &test) {
    StringStream<char16_t> ss;
    Value<char16_t>        value;
    const char16_t        *content;

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    test.IsEqual(Template::Render(uR"({var:a})", value, ss), uR"({var:a})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[0]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[a]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:a[abc]})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:a[abc]})", __LINE__);
    ss.Clear();

    ////////////////

    value = JSON::Parse(uR"([[[]],{"a":["x"],"b":{"a":"X"}}])");

    content = uR"({var:0})";
    test.IsEqual(Template::Render(content, StringUtils::Count(content), value, ss), uR"({var:0})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0]})", __LINE__);
    ss.Clear();

    content = uR"({var:0[0][0]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0[0][0]})", __LINE__);
    ss.Clear();

    /////

    content = uR"({var:1})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1})", __LINE__);
    ss.Clear();

    content = uR"({var:2})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:2})", __LINE__);
    ss.Clear();

    content = uR"({var:1[a]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[a]})", __LINE__);
    ss.Clear();

    content = uR"({var:1[b]})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1[b]})", __LINE__);
    ss.Clear();

    ////

    value = JSON::Parse(uR"(["A", "abc", true, 456, 1.5])");

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"(var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0})", __LINE__);
    ss.Clear();

    content = uR"({v})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v})", __LINE__);
    ss.Clear();

    content = uR"({va})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va})", __LINE__);
    ss.Clear();

    content = uR"({var})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var})", __LINE__);
    ss.Clear();

    content = uR"({var:})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:})", __LINE__);
    ss.Clear();

    content = uR"({v:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v:0})", __LINE__);
    ss.Clear();

    content = uR"({va:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va:0})", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0A)", __LINE__);
    ss.Clear();

    content = uR"(var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:0}A)", __LINE__);
    ss.Clear();

    content = uR"({var:0{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1A)", __LINE__);
    ss.Clear();

    content = uR"(var:1}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"(var:1}A)", __LINE__);
    ss.Clear();

    content = uR"({var:1{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:1AA)", __LINE__);
    ss.Clear();

    ////

    content = uR"({{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({A)", __LINE__);
    ss.Clear();

    content = uR"({{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({AA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vA)", __LINE__);
    ss.Clear();

    content = uR"({v{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vAA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaA)", __LINE__);
    ss.Clear();

    content = uR"({va{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({vaAA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varA)", __LINE__);
    ss.Clear();

    content = uR"({var{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({varAA)", __LINE__);
    ss.Clear();

    ///

    content = uR"({-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-A)", __LINE__);
    ss.Clear();

    content = uR"({-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({-AA)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-A)", __LINE__);
    ss.Clear();

    content = uR"({v-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({v-AA)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-A)", __LINE__);
    ss.Clear();

    content = uR"({va-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({va-AA)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-A)", __LINE__);
    ss.Clear();

    content = uR"({var-{var:0}{var:0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-AA)", __LINE__);
    ss.Clear();

    //

    content = uR"({var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var-0})", __LINE__);
    ss.Clear();

    content = uR"({var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"({var 0})", __LINE__);
    ss.Clear();

    content = uR"({var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 })", __LINE__);
    ss.Clear();

    content = uR"({var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0 )", __LINE__);
    ss.Clear();

    content = uR"({var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"({var:0)", __LINE__);
    ss.Clear();

    content = uR"( {var-0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var-0})", __LINE__);
    ss.Clear();

    content = uR"( {var 0})";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var 0})", __LINE__);
    ss.Clear();

    content = uR"( {var:0 })";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 })", __LINE__);
    ss.Clear();

    content = uR"( {var:0 )";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0 )", __LINE__);
    ss.Clear();

    content = uR"( {var:0)";
    test.IsEqual(Template::Render(content, value, ss), uR"( {var:0)", __LINE__);
    ss.Clear();
}